

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# st.c
# Opt level: O0

int onig_st_insert(st_table *table,st_data_t key,st_data_t value)

{
  uint uVar1;
  int iVar2;
  st_table_entry *psVar3;
  bool bVar4;
  st_table_entry *entry;
  st_table_entry *ptr;
  uint bin_pos;
  uint hash_val;
  st_data_t value_local;
  st_data_t key_local;
  st_table *table_local;
  
  uVar1 = (*table->type->hash)(key);
  ptr._0_4_ = uVar1 % (uint)table->num_bins;
  entry = table->bins[(uint)ptr];
  if ((entry != (st_table_entry *)0x0) &&
     ((entry->hash != uVar1 ||
      ((key != entry->key && (iVar2 = (*table->type->compare)(key,entry->key), iVar2 != 0)))))) {
    while( true ) {
      bVar4 = false;
      if ((entry->next != (st_table_entry *)0x0) && (bVar4 = true, entry->next->hash == uVar1)) {
        bVar4 = true;
        if (key != entry->next->key) {
          iVar2 = (*table->type->compare)(key,entry->next->key);
          bVar4 = iVar2 == 0;
        }
        bVar4 = (bool)(bVar4 ^ 1);
      }
      if (!bVar4) break;
      entry = entry->next;
    }
    entry = entry->next;
  }
  if (entry == (st_table_entry *)0x0) {
    if (5 < table->num_entries / table->num_bins) {
      rehash(table);
      ptr._0_4_ = uVar1 % (uint)table->num_bins;
    }
    psVar3 = (st_table_entry *)malloc(0x20);
    if (psVar3 == (st_table_entry *)0x0) {
      table_local._4_4_ = -5;
    }
    else {
      psVar3->hash = uVar1;
      psVar3->key = key;
      psVar3->record = value;
      psVar3->next = table->bins[(uint)ptr];
      table->bins[(uint)ptr] = psVar3;
      table->num_entries = table->num_entries + 1;
      table_local._4_4_ = 0;
    }
  }
  else {
    entry->record = value;
    table_local._4_4_ = 1;
  }
  return table_local._4_4_;
}

Assistant:

extern int
st_insert(register st_table* table, register st_data_t key, st_data_t value)
{
  unsigned int hash_val, bin_pos;
  register st_table_entry *ptr;

  hash_val = do_hash(key, table);
  FIND_ENTRY(table, ptr, hash_val, bin_pos);

  if (ptr == 0) {
    ADD_DIRECT(table, key, value, hash_val, bin_pos, ONIGERR_MEMORY);
    return 0;
  }
  else {
    ptr->record = value;
    return 1;
  }
}